

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::UntypedMapBase::InsertUniqueInList
          (UntypedMapBase *this,map_index_t b,NodeBase *node)

{
  NodeBase *pNVar1;
  undefined1 auVar2 [16];
  map_index_t b_00;
  TableEntryPtr *pTVar3;
  ulong *puVar4;
  iterator *it;
  ulong uVar5;
  undefined1 *puVar6;
  UntypedMapBase *pUVar7;
  undefined1 auStack_28 [8];
  undefined8 uStack_20;
  
  uVar5 = (ulong)b;
  pTVar3 = this->table_;
  pNVar1 = (NodeBase *)pTVar3[b];
  if (pNVar1 == (NodeBase *)0x0) {
LAB_0015d6e5:
    node->next = pNVar1;
    if (((ulong)node & 1) == 0) {
      pTVar3[b] = (TableEntryPtr)node;
      return;
    }
  }
  else {
    uVar5 = ((ulong)this->seed_ ^ (ulong)node) % 0xd;
    if (6 < uVar5) {
      if (((ulong)pNVar1 & 1) == 0) {
        node->next = pNVar1->next;
        pNVar1->next = node;
        return;
      }
      goto LAB_0015d70a;
    }
    if (((ulong)pNVar1 & 1) == 0) goto LAB_0015d6e5;
    uStack_20._0_4_ = 0x15d700;
    uStack_20._4_4_ = 0;
    InsertUniqueInList((UntypedMapBase *)&stack0xfffffffffffffff0);
  }
  uStack_20._0_4_ = 0x15d70a;
  uStack_20._4_4_ = 0;
  InsertUniqueInList((UntypedMapBase *)&stack0xfffffffffffffff0);
LAB_0015d70a:
  pUVar7 = (UntypedMapBase *)&stack0xfffffffffffffff0;
  uStack_20 = TableEntryIsTooLong;
  InsertUniqueInList(pUVar7);
  pTVar3 = (TableEntryPtr *)pUVar7->table_[uVar5 & 0xffffffff];
  if (((ulong)pTVar3 & 1) == 0) {
    pUVar7 = (UntypedMapBase *)0x0;
    do {
      pUVar7 = (UntypedMapBase *)((long)&pUVar7->num_elements_ + 1);
      pTVar3 = (TableEntryPtr *)*pTVar3;
    } while (pTVar3 != (TableEntryPtr *)0x0);
    if (pUVar7 < (UntypedMapBase *)0x9) {
      return;
    }
  }
  else {
    pUVar7 = (UntypedMapBase *)auStack_28;
    TableEntryIsTooLong(pUVar7);
  }
  puVar6 = auStack_28;
  TableEntryIsTooLong();
  b_00 = KeyMapBase<unsigned_int>::BucketNumber((KeyMapBase<unsigned_int> *)pUVar7,(ViewType)puVar6)
  ;
  puVar4 = (ulong *)pUVar7->table_[b_00];
  if (((ulong)puVar4 & 1) == 0 && puVar4 != (ulong *)0x0) {
    do {
      if ((ViewType)puVar4[1] == (ViewType)puVar6) {
        return;
      }
      puVar4 = (ulong *)*puVar4;
    } while (puVar4 != (ulong *)0x0);
  }
  else if (((ulong)puVar4 & 1) != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (ulong)puVar6 & 0xffffffff;
    FindFromTree(pUVar7,b_00,(VariantKey)(auVar2 << 0x40),it);
  }
  return;
}

Assistant:

void InsertUniqueInList(map_index_t b, NodeBase* node) {
    if (!TableEntryIsEmpty(b) && ShouldInsertAfterHead(node)) {
      auto* first = TableEntryToNode(table_[b]);
      node->next = first->next;
      first->next = node;
    } else {
      node->next = TableEntryToNode(table_[b]);
      table_[b] = NodeToTableEntry(node);
    }
  }